

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_impl.cpp
# Opt level: O0

void Al::internal::mpi::finalize(void)

{
  void *pvVar1;
  int flag;
  int local_4;
  
  pvVar1 = (anonymous_namespace)::al_world_comm;
  if ((anonymous_namespace)::al_world_comm != (void *)0x0) {
    if ((anonymous_namespace)::al_world_comm != (void *)0x0) {
      MPICommunicator::~MPICommunicator((MPICommunicator *)0x13528a);
      operator_delete(pvVar1,0x30);
    }
    (anonymous_namespace)::al_world_comm = (void *)0x0;
  }
  MPI_Finalized(&local_4);
  if ((local_4 == 0) && (((anonymous_namespace)::initialized_mpi & 1) != 0)) {
    MPI_Finalize();
  }
  return;
}

Assistant:

void finalize() {
  // Communicator teardown is safe even when MPI has already been finalized.
  if (al_world_comm) {
    delete al_world_comm;
    al_world_comm = nullptr;
  }

  int flag;
  MPI_Finalized(&flag);
  if (!flag) {
#ifdef AL_HAS_HALF
    // Clean up reduction operations.
    MPI_Op_free(&half_sum_op);
    MPI_Op_free(&half_prod_op);
    MPI_Op_free(&half_min_op);
    MPI_Op_free(&half_max_op);
#endif
#ifdef AL_HAS_BFLOAT
    // Clean up reduction operations.
    MPI_Op_free(&bfloat_sum_op);
    MPI_Op_free(&bfloat_prod_op);
    MPI_Op_free(&bfloat_min_op);
    MPI_Op_free(&bfloat_max_op);
#endif
    if (initialized_mpi) {
      MPI_Finalize();
    }
  }
}